

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

ReferenceCounterValueType __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::Release
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this)

{
  ReferenceCounterValueType RVar1;
  RenderDeviceBase<Diligent::EngineVkImplTraits> *this_local;
  
  RVar1 = RefCountedObject<Diligent::IRenderDeviceVk>::Release
                    ((RefCountedObject<Diligent::IRenderDeviceVk> *)this);
  return RVar1;
}

Assistant:

Release() override final
    {
        return TObjectBase::Release();
    }